

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O0

int file_new(archive_write *a,archive_entry *entry,file **newfile)

{
  wchar_t wVar1;
  mode_t mVar2;
  int *piVar3;
  void *pvVar4;
  int64_t iVar5;
  char *__s;
  size_t sVar6;
  time_t tVar7;
  long lVar8;
  int local_4c;
  size_t sStack_48;
  int ret;
  size_t u16len;
  char *u16;
  file *file;
  _7zip_conflict *zip;
  file **newfile_local;
  archive_entry *entry_local;
  archive_write *a_local;
  
  local_4c = 0;
  file = (file *)a->format_data;
  *newfile = (file *)0x0;
  zip = (_7zip_conflict *)newfile;
  newfile_local = (file **)entry;
  entry_local = (archive_entry *)a;
  u16 = (char *)calloc(1,0x80);
  if (u16 == (char *)0x0) {
    archive_set_error((archive *)entry_local,0xc,"Can\'t allocate memory");
    a_local._4_4_ = -0x1e;
  }
  else {
    wVar1 = _archive_entry_pathname_l
                      ((archive_entry *)newfile_local,(char **)&u16len,&stack0xffffffffffffffb8,
                       (archive_string_conv *)file[2].rbnode.rb_nodes[0]);
    if (wVar1 < L'\0') {
      piVar3 = __errno_location();
      if (*piVar3 == 0xc) {
        free(u16);
        archive_set_error((archive *)entry_local,0xc,"Can\'t allocate memory for UTF-16LE");
        return -0x1e;
      }
      archive_set_error((archive *)entry_local,-1,
                        "A filename cannot be converted to UTF-16LE;You should disable making Joliet extension"
                       );
      local_4c = -0x14;
    }
    pvVar4 = malloc(sStack_48 + 2);
    *(void **)(u16 + 0x28) = pvVar4;
    if (*(long *)(u16 + 0x28) == 0) {
      free(u16);
      archive_set_error((archive *)entry_local,0xc,"Can\'t allocate memory for Name");
      a_local._4_4_ = -0x1e;
    }
    else {
      memcpy(*(void **)(u16 + 0x28),(void *)u16len,sStack_48);
      *(undefined1 *)(*(long *)(u16 + 0x28) + sStack_48) = 0;
      *(undefined1 *)(*(long *)(u16 + 0x28) + 1 + sStack_48) = 0;
      *(int *)(u16 + 0x20) = (int)sStack_48;
      mVar2 = archive_entry_mode((archive_entry *)newfile_local);
      *(mode_t *)(u16 + 0x70) = mVar2;
      mVar2 = archive_entry_filetype((archive_entry *)newfile_local);
      if (mVar2 == 0x8000) {
        iVar5 = archive_entry_size((archive_entry *)newfile_local);
        *(int64_t *)(u16 + 0x30) = iVar5;
      }
      else {
        archive_entry_set_size((archive_entry *)newfile_local,0);
      }
      mVar2 = archive_entry_filetype((archive_entry *)newfile_local);
      if (mVar2 == 0x4000) {
        u16[0x78] = u16[0x78] & 0xfeU | 1;
      }
      else {
        mVar2 = archive_entry_filetype((archive_entry *)newfile_local);
        if (mVar2 == 0xa000) {
          __s = archive_entry_symlink((archive_entry *)newfile_local);
          sVar6 = strlen(__s);
          *(size_t *)(u16 + 0x30) = sVar6;
        }
      }
      wVar1 = archive_entry_mtime_is_set((archive_entry *)newfile_local);
      if (wVar1 != L'\0') {
        *(uint *)(u16 + 0x38) = *(uint *)(u16 + 0x38) | 1;
        tVar7 = archive_entry_mtime((archive_entry *)newfile_local);
        *(time_t *)(u16 + 0x40) = tVar7;
        lVar8 = archive_entry_mtime_nsec((archive_entry *)newfile_local);
        *(long *)(u16 + 0x48) = lVar8;
      }
      wVar1 = archive_entry_atime_is_set((archive_entry *)newfile_local);
      if (wVar1 != L'\0') {
        *(uint *)(u16 + 0x38) = *(uint *)(u16 + 0x38) | 2;
        tVar7 = archive_entry_atime((archive_entry *)newfile_local);
        *(time_t *)(u16 + 0x50) = tVar7;
        lVar8 = archive_entry_atime_nsec((archive_entry *)newfile_local);
        *(long *)(u16 + 0x58) = lVar8;
      }
      wVar1 = archive_entry_ctime_is_set((archive_entry *)newfile_local);
      if (wVar1 != L'\0') {
        *(uint *)(u16 + 0x38) = *(uint *)(u16 + 0x38) | 4;
        tVar7 = archive_entry_ctime((archive_entry *)newfile_local);
        *(time_t *)(u16 + 0x60) = tVar7;
        lVar8 = archive_entry_ctime_nsec((archive_entry *)newfile_local);
        *(long *)(u16 + 0x68) = lVar8;
      }
      *(char **)zip = u16;
      a_local._4_4_ = local_4c;
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
file_new(struct archive_write *a, struct archive_entry *entry,
    struct file **newfile)
{
	struct _7zip *zip;
	struct file *file;
	const char *u16;
	size_t u16len;
	int ret = ARCHIVE_OK;

	zip = (struct _7zip *)a->format_data;
	*newfile = NULL;

	file = calloc(1, sizeof(*file));
	if (file == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate memory");
		return (ARCHIVE_FATAL);
	}

	if (0 > archive_entry_pathname_l(entry, &u16, &u16len, zip->sconv)) {
		if (errno == ENOMEM) {
			free(file);
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for UTF-16LE");
			return (ARCHIVE_FATAL);
		}
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "A filename cannot be converted to UTF-16LE;"
		    "You should disable making Joliet extension");
		ret = ARCHIVE_WARN;
	}
	file->utf16name = malloc(u16len + 2);
	if (file->utf16name == NULL) {
		free(file);
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate memory for Name");
		return (ARCHIVE_FATAL);
	}
	memcpy(file->utf16name, u16, u16len);
	file->utf16name[u16len+0] = 0;
	file->utf16name[u16len+1] = 0;
	file->name_len = (unsigned)u16len;
	file->mode = archive_entry_mode(entry);
	if (archive_entry_filetype(entry) == AE_IFREG)
		file->size = archive_entry_size(entry);
	else
		archive_entry_set_size(entry, 0);
	if (archive_entry_filetype(entry) == AE_IFDIR)
		file->dir = 1;
	else if (archive_entry_filetype(entry) == AE_IFLNK)
		file->size = strlen(archive_entry_symlink(entry));
	if (archive_entry_mtime_is_set(entry)) {
		file->flg |= MTIME_IS_SET;
		file->times[MTIME].time = archive_entry_mtime(entry);
		file->times[MTIME].time_ns = archive_entry_mtime_nsec(entry);
	}
	if (archive_entry_atime_is_set(entry)) {
		file->flg |= ATIME_IS_SET;
		file->times[ATIME].time = archive_entry_atime(entry);
		file->times[ATIME].time_ns = archive_entry_atime_nsec(entry);
	}
	if (archive_entry_ctime_is_set(entry)) {
		file->flg |= CTIME_IS_SET;
		file->times[CTIME].time = archive_entry_ctime(entry);
		file->times[CTIME].time_ns = archive_entry_ctime_nsec(entry);
	}

	*newfile = file;
	return (ret);
}